

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O3

void __thiscall
TEST_MockExpectedCall_toStringForMultipleOutputParameters_Test::testBody
          (TEST_MockExpectedCall_toStringForMultipleOutputParameters_Test *this)

{
  UtestShell *pUVar1;
  char *pcVar2;
  TestTerminator *pTVar3;
  uchar buffer_value [3];
  MockCheckedExpectedCall expectedCall;
  undefined1 local_c8 [184];
  
  MockCheckedExpectedCall::MockCheckedExpectedCall((MockCheckedExpectedCall *)(local_c8 + 0x18),1);
  SimpleString::SimpleString((SimpleString *)local_c8,"name");
  MockCheckedExpectedCall::withName
            ((MockCheckedExpectedCall *)(local_c8 + 0x18),(SimpleString *)local_c8);
  SimpleString::~SimpleString((SimpleString *)local_c8);
  SimpleString::SimpleString((SimpleString *)local_c8,"buffer1");
  MockCheckedExpectedCall::withOutputParameterReturning
            ((MockCheckedExpectedCall *)(local_c8 + 0x18),(SimpleString *)local_c8,local_c8 + 0x15,3
            );
  SimpleString::~SimpleString((SimpleString *)local_c8);
  SimpleString::SimpleString((SimpleString *)local_c8,"buffer2");
  MockCheckedExpectedCall::withOutputParameterReturning
            ((MockCheckedExpectedCall *)(local_c8 + 0x18),(SimpleString *)local_c8,local_c8 + 0x15,3
            );
  SimpleString::~SimpleString((SimpleString *)local_c8);
  MockCheckedExpectedCall::callWasMade((MockCheckedExpectedCall *)(local_c8 + 0x18),1);
  pUVar1 = UtestShell::getCurrent();
  MockCheckedExpectedCall::callToString((MockCheckedExpectedCall *)local_c8);
  pcVar2 = SimpleString::asCharString((SimpleString *)local_c8);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,
             "name -> const void* buffer1: <output>, const void* buffer2: <output> (expected 1 call, called 1 time)"
             ,pcVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x267,pTVar3);
  SimpleString::~SimpleString((SimpleString *)local_c8);
  MockCheckedExpectedCall::~MockCheckedExpectedCall((MockCheckedExpectedCall *)(local_c8 + 0x18));
  return;
}

Assistant:

TEST(MockExpectedCall, toStringForMultipleOutputParameters)
{
    unsigned char buffer_value[3];

    MockCheckedExpectedCall expectedCall(1);
    expectedCall.withName("name");
    expectedCall.withOutputParameterReturning("buffer1", buffer_value, sizeof(buffer_value));
    expectedCall.withOutputParameterReturning("buffer2", buffer_value, sizeof(buffer_value));
    expectedCall.callWasMade(1);
    STRCMP_EQUAL("name -> const void* buffer1: <output>, const void* buffer2: <output> (expected 1 call, called 1 time)", expectedCall.callToString().asCharString());
}